

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

void g_ptr_array_insert(GPtrArray *array,gint index_,gpointer data)

{
  GRealPtrArray *rarray;
  gpointer data_local;
  gint index__local;
  GPtrArray *array_local;
  
  g_ptr_array_maybe_expand((GRealPtrArray *)array,1);
  data_local._4_4_ = index_;
  if (index_ < 0) {
    data_local._4_4_ = array->len;
  }
  if (data_local._4_4_ < array->len) {
    memmove(array->pdata + (int)(data_local._4_4_ + 1),array->pdata + (int)data_local._4_4_,
            (ulong)(array->len - data_local._4_4_) << 3);
  }
  array->len = array->len + 1;
  array->pdata[(int)data_local._4_4_] = data;
  return;
}

Assistant:

void g_ptr_array_insert (GPtrArray *array, gint index_, gpointer data)
{
    GRealPtrArray *rarray = (GRealPtrArray *)array;

    g_return_if_fail (rarray);
    g_return_if_fail (index_ >= -1);
    g_return_if_fail (index_ <= (gint)rarray->len);

    g_ptr_array_maybe_expand (rarray, 1);

    if (index_ < 0)
        index_ = rarray->len;

    if ((guint) index_ < rarray->len)
        memmove (&(rarray->pdata[index_ + 1]),
                &(rarray->pdata[index_]),
                (rarray->len - index_) * sizeof (gpointer));

    rarray->len++;
    rarray->pdata[index_] = data;
}